

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.cpp
# Opt level: O2

RayDifferential * __thiscall
pbrt::SurfaceInteraction::SpawnRay
          (RayDifferential *__return_storage_ptr__,SurfaceInteraction *this,RayDifferential *rayi,
          BSDF *bsdf,Vector3f *wi,BxDFFlags flags)

{
  Vector3f *c;
  Normal3f *this_00;
  Normal3f *this_01;
  undefined4 uVar1;
  undefined4 uVar2;
  Tuple3<pbrt::Vector3,_float> *pTVar3;
  undefined4 uVar4;
  type tVar5;
  float fVar6;
  float fVar28;
  float fVar30;
  undefined8 uVar31;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar35;
  undefined1 auVar9 [16];
  float fVar29;
  float fVar36;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 uVar32;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  Normal3<float> NVar40;
  Normal3<float> NVar41;
  Vector3<float> VVar42;
  Vector3<float> VVar43;
  Point3f PVar44;
  Point3<float> PVar45;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  Normal3<float> local_110;
  Normal3<float> local_100;
  Normal3<float> local_f0;
  Tuple3<pbrt::Vector3,_float> *local_e0;
  Tuple3<pbrt::Vector3,_float> local_d8;
  undefined1 local_c8 [16];
  float local_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [8];
  undefined8 uStack_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  Tuple3<pbrt::Vector3,_float> local_50;
  Tuple3<pbrt::Vector3,_float> local_40;
  undefined1 extraout_var [60];
  undefined1 auVar33 [56];
  undefined1 auVar34 [56];
  
  local_98._8_8_ = local_98._0_8_;
  Interaction::SpawnRay(__return_storage_ptr__,&this->super_Interaction,wi);
  if (rayi->hasDifferentials == true) {
    local_100.super_Tuple3<pbrt::Normal3,_float>.z =
         (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
    this_00 = &(this->shading).dndu;
    local_98._0_8_ = bsdf;
    uVar1 = (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
    uVar2 = (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
    uVar32 = 0;
    local_100.super_Tuple3<pbrt::Normal3,_float>.x = (float)uVar1;
    local_100.super_Tuple3<pbrt::Normal3,_float>.y = (float)uVar2;
    local_e0 = &wi->super_Tuple3<pbrt::Vector3,_float>;
    NVar40 = Tuple3<pbrt::Normal3,float>::operator*
                       ((Tuple3<pbrt::Normal3,float> *)this_00,this->dudx);
    uVar31 = 0;
    this_01 = &(this->shading).dndv;
    NVar41 = Tuple3<pbrt::Normal3,float>::operator*
                       ((Tuple3<pbrt::Normal3,float> *)this_01,this->dvdx);
    local_138 = NVar40.super_Tuple3<pbrt::Normal3,_float>.x;
    fStack_134 = NVar40.super_Tuple3<pbrt::Normal3,_float>.y;
    fStack_130 = (float)uVar32;
    fStack_12c = (float)((ulong)uVar32 >> 0x20);
    auVar8._0_4_ = NVar41.super_Tuple3<pbrt::Normal3,_float>.x + local_138;
    auVar8._4_4_ = NVar41.super_Tuple3<pbrt::Normal3,_float>.y + fStack_134;
    auVar8._8_4_ = (float)uVar31 + fStack_130;
    auVar8._12_4_ = (float)((ulong)uVar31 >> 0x20) + fStack_12c;
    local_f0.super_Tuple3<pbrt::Normal3,_float>.z =
         NVar41.super_Tuple3<pbrt::Normal3,_float>.z + NVar40.super_Tuple3<pbrt::Normal3,_float>.z;
    local_f0.super_Tuple3<pbrt::Normal3,_float>._0_8_ = vmovlps_avx(auVar8);
    uVar32 = 0;
    NVar40 = Tuple3<pbrt::Normal3,float>::operator*
                       ((Tuple3<pbrt::Normal3,float> *)this_00,this->dudy);
    uVar31 = 0;
    NVar41 = Tuple3<pbrt::Normal3,float>::operator*
                       ((Tuple3<pbrt::Normal3,float> *)this_01,this->dvdy);
    local_138 = NVar40.super_Tuple3<pbrt::Normal3,_float>.x;
    fStack_134 = NVar40.super_Tuple3<pbrt::Normal3,_float>.y;
    fStack_130 = (float)uVar32;
    fStack_12c = (float)((ulong)uVar32 >> 0x20);
    auVar7._0_4_ = NVar41.super_Tuple3<pbrt::Normal3,_float>.x + local_138;
    auVar7._4_4_ = NVar41.super_Tuple3<pbrt::Normal3,_float>.y + fStack_134;
    auVar7._8_4_ = (float)uVar31 + fStack_130;
    auVar7._12_4_ = (float)((ulong)uVar31 >> 0x20) + fStack_12c;
    auVar33 = ZEXT856(auVar7._8_8_);
    local_110.super_Tuple3<pbrt::Normal3,_float>.z =
         NVar41.super_Tuple3<pbrt::Normal3,_float>.z + NVar40.super_Tuple3<pbrt::Normal3,_float>.z;
    local_110.super_Tuple3<pbrt::Normal3,_float>._0_8_ = vmovlps_avx(auVar7);
    VVar42 = Tuple3<pbrt::Vector3,_float>::operator-
                       (&(rayi->rxDirection).super_Tuple3<pbrt::Vector3,_float>);
    local_40.z = VVar42.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar15._0_8_ = VVar42.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar15._8_56_ = auVar33;
    c = &(this->super_Interaction).wo;
    local_40._0_8_ = vmovlps_avx(auVar15._0_16_);
    VVar42 = Tuple3<pbrt::Vector3,float>::operator-(&local_40,c);
    fVar35 = VVar42.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar16._0_8_ = VVar42.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar16._8_56_ = auVar33;
    auVar8 = auVar16._0_16_;
    local_50._0_8_ = vmovlps_avx(auVar8);
    auVar34 = auVar33;
    local_50.z = fVar35;
    VVar43 = Tuple3<pbrt::Vector3,_float>::operator-
                       (&(rayi->ryDirection).super_Tuple3<pbrt::Vector3,_float>);
    local_d8.z = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar17._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar17._8_56_ = auVar34;
    local_d8._0_8_ = vmovlps_avx(auVar17._0_16_);
    VVar43 = Tuple3<pbrt::Vector3,float>::operator-(&local_d8,c);
    fVar36 = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar18._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar18._8_56_ = auVar34;
    _local_88 = auVar18._0_16_;
    local_40._0_8_ = vmovlps_avx(_local_88);
    local_40.z = fVar36;
    if (flags == SpecularTransmission) {
      __return_storage_ptr__->hasDifferentials = true;
      PVar44 = Interaction::p(&this->super_Interaction);
      local_d8.z = PVar44.super_Tuple3<pbrt::Point3,_float>.z;
      auVar23._0_8_ = PVar44.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar23._8_56_ = auVar34;
      local_d8._0_8_ = vmovlps_avx(auVar23._0_16_);
      PVar45 = Point3<float>::operator+((Point3<float> *)&local_d8,&this->dpdx);
      auVar24._0_8_ = PVar45.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar24._8_56_ = auVar34;
      uVar32 = vmovlps_avx(auVar24._0_16_);
      (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar32;
      (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar32 >> 0x20);
      (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z =
           PVar45.super_Tuple3<pbrt::Point3,_float>.z;
      PVar44 = Interaction::p(&this->super_Interaction);
      local_d8.z = PVar44.super_Tuple3<pbrt::Point3,_float>.z;
      auVar25._0_8_ = PVar44.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar25._8_56_ = auVar34;
      local_d8._0_8_ = vmovlps_avx(auVar25._0_16_);
      PVar45 = Point3<float>::operator+((Point3<float> *)&local_d8,&this->dpdy);
      auVar26._0_8_ = PVar45.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar26._8_56_ = auVar34;
      uVar32 = vmovlps_avx(auVar26._0_16_);
      (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar32;
      (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar32 >> 0x20);
      (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z =
           PVar45.super_Tuple3<pbrt::Point3,_float>.z;
      local_98._0_4_ = 1.0 / *(float *)local_98._0_8_;
      local_98._4_12_ = SUB6012((undefined1  [60])0x0,0);
      tVar5 = Dot<float>(c,&local_100);
      auVar11 = ZEXT416((uint)local_100.super_Tuple3<pbrt::Normal3,_float>.x);
      if (0.0 <= tVar5) {
        auVar37._4_4_ = local_100.super_Tuple3<pbrt::Normal3,_float>.z;
        auVar37._0_4_ = local_100.super_Tuple3<pbrt::Normal3,_float>.y;
        auVar37._8_8_ = 0;
      }
      else {
        auVar11._0_4_ = -local_100.super_Tuple3<pbrt::Normal3,_float>.x;
        auVar11._4_4_ = 0x80000000;
        auVar11._8_4_ = 0x80000000;
        auVar11._12_4_ = 0x80000000;
        auVar37._0_8_ =
             CONCAT44(local_100.super_Tuple3<pbrt::Normal3,_float>.z,
                      local_100.super_Tuple3<pbrt::Normal3,_float>.y) ^ 0x8000000080000000;
        auVar37._8_4_ = 0x80000000;
        auVar37._12_4_ = 0x80000000;
        local_f0.super_Tuple3<pbrt::Normal3,_float>.z =
             -local_f0.super_Tuple3<pbrt::Normal3,_float>.z;
        auVar7 = vunpcklps_avx(auVar11,auVar37);
        uVar32 = vmovlps_avx(auVar7);
        local_100.super_Tuple3<pbrt::Normal3,_float>.x = (float)uVar32;
        local_100.super_Tuple3<pbrt::Normal3,_float>.y = (float)((ulong)uVar32 >> 0x20);
        local_100.super_Tuple3<pbrt::Normal3,_float>.z = (float)vextractps_avx(auVar37,1);
        auVar38._0_8_ = local_f0.super_Tuple3<pbrt::Normal3,_float>._0_8_ ^ 0x8000000080000000;
        auVar38._8_4_ = 0x80000000;
        auVar38._12_4_ = 0x80000000;
        local_f0.super_Tuple3<pbrt::Normal3,_float>._0_8_ = vmovlps_avx(auVar38);
        auVar39._0_8_ = local_110.super_Tuple3<pbrt::Normal3,_float>._0_8_ ^ 0x8000000080000000;
        auVar39._8_4_ = 0x80000000;
        auVar39._12_4_ = 0x80000000;
        local_110.super_Tuple3<pbrt::Normal3,_float>.z =
             -local_110.super_Tuple3<pbrt::Normal3,_float>.z;
        local_110.super_Tuple3<pbrt::Normal3,_float>._0_8_ = vmovlps_avx(auVar39);
      }
      auVar7 = vmovshdup_avx(auVar37);
      auVar38 = vmovshdup_avx(auVar8);
      auVar39 = ZEXT416((uint)(auVar7._0_4_ * fVar35));
      auVar37 = vfmadd213ss_fma(auVar38,auVar37,auVar39);
      auVar7 = vfmsub213ss_fma(auVar7,ZEXT416((uint)fVar35),auVar39);
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(auVar37._0_4_ + auVar7._0_4_)),auVar8,auVar11);
      local_c8._0_4_ = auVar8._0_4_;
      tVar5 = Dot<float>(c,&local_f0);
      auVar8 = vmovshdup_avx(_local_88);
      local_68._0_4_ = tVar5 + (float)local_c8._0_4_;
      auVar8 = vfmadd132ss_fma(auVar8,ZEXT416((uint)(local_100.super_Tuple3<pbrt::Normal3,_float>.z
                                                    * fVar36)),
                               ZEXT416((uint)local_100.super_Tuple3<pbrt::Normal3,_float>.y));
      auVar7 = vfmsub213ss_fma(ZEXT416((uint)local_100.super_Tuple3<pbrt::Normal3,_float>.z),
                               ZEXT416((uint)fVar36),
                               ZEXT416((uint)(local_100.super_Tuple3<pbrt::Normal3,_float>.z *
                                             fVar36)));
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(auVar8._0_4_ + auVar7._0_4_)),_local_88,
                               ZEXT416((uint)local_100.super_Tuple3<pbrt::Normal3,_float>.x));
      local_c8._0_4_ = auVar8._0_4_;
      tVar5 = Dot<float>(c,&local_110);
      local_78 = tVar5 + (float)local_c8._0_4_;
      local_c8._0_4_ = Dot<float>(c,&local_100);
      pTVar3 = local_e0;
      auVar27._0_4_ = AbsDot<float>((Vector3<float> *)local_e0,&local_100);
      auVar27._4_60_ = extraout_var;
      local_c8 = vfmsub231ss_fma(auVar27._0_16_,local_98,ZEXT416((uint)local_c8._0_4_));
      local_a8._0_4_ = local_98._0_4_ * local_98._0_4_;
      tVar5 = Dot<float>(c,&local_100);
      local_ac = tVar5 * (float)local_a8._0_4_;
      tVar5 = AbsDot<float>((Vector3<float> *)pTVar3,&local_100);
      local_68 = ZEXT416((uint)(((float)local_98._0_4_ - local_ac / tVar5) * (float)local_68._0_4_))
      ;
      tVar5 = Dot<float>(c,&local_100);
      local_a8._0_4_ = tVar5 * (float)local_a8._0_4_;
      tVar5 = AbsDot<float>((Vector3<float> *)pTVar3,&local_100);
      local_d8.z = (float)local_98._0_4_ * fVar35;
      local_a8 = ZEXT416((uint)(((float)local_98._0_4_ - (float)local_a8._0_4_ / tVar5) * local_78))
      ;
      local_78 = (float)local_98._0_4_;
      fStack_74 = (float)local_98._0_4_;
      fStack_70 = (float)local_98._0_4_;
      fStack_6c = (float)local_98._0_4_;
      local_138 = VVar42.super_Tuple3<pbrt::Vector3,_float>.x;
      fStack_134 = VVar42.super_Tuple3<pbrt::Vector3,_float>.y;
      fStack_130 = auVar33._0_4_;
      fStack_12c = auVar33._4_4_;
      auVar12._0_4_ = (float)local_98._0_4_ * local_138;
      auVar12._4_4_ = (float)local_98._0_4_ * fStack_134;
      auVar12._8_4_ = (float)local_98._0_4_ * fStack_130;
      auVar12._12_4_ = (float)local_98._0_4_ * fStack_12c;
      uVar32 = auVar12._8_8_;
      local_d8._0_8_ = vmovlps_avx(auVar12);
      VVar42 = Tuple3<pbrt::Vector3,float>::operator-(pTVar3,(Vector3<float> *)&local_d8);
      uVar4 = local_c8._0_4_;
      auVar13._0_4_ =
           VVar42.super_Tuple3<pbrt::Vector3,_float>.x +
           (float)local_c8._0_4_ * local_f0.super_Tuple3<pbrt::Normal3,_float>.x +
           (float)local_68._0_4_ * local_100.super_Tuple3<pbrt::Normal3,_float>.x;
      auVar13._4_4_ =
           VVar42.super_Tuple3<pbrt::Vector3,_float>.y +
           (float)local_c8._0_4_ * local_f0.super_Tuple3<pbrt::Normal3,_float>.y +
           (float)local_68._0_4_ * local_100.super_Tuple3<pbrt::Normal3,_float>.y;
      auVar13._8_4_ = (float)uVar32 + (float)local_c8._0_4_ * 0.0 + (float)local_68._0_4_ * 0.0;
      auVar13._12_4_ =
           (float)((ulong)uVar32 >> 0x20) +
           (float)local_c8._0_4_ * 0.0 + (float)local_68._0_4_ * 0.0;
      uVar32 = vmovlps_avx(auVar13);
      (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x =
           (float)(int)uVar32;
      (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)uVar32 >> 0x20);
      (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z =
           VVar42.super_Tuple3<pbrt::Vector3,_float>.z +
           (float)local_c8._0_4_ * local_f0.super_Tuple3<pbrt::Normal3,_float>.z +
           (float)local_68._0_4_ * local_100.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar14._0_4_ = local_78 * (float)local_88._0_4_;
      auVar14._4_4_ = fStack_74 * (float)local_88._4_4_;
      auVar14._8_4_ = fStack_70 * (float)uStack_80;
      auVar14._12_4_ = fStack_6c * uStack_80._4_4_;
      uVar32 = auVar14._8_8_;
      local_d8.z = (float)local_98._0_4_ * fVar36;
      local_d8._0_8_ = vmovlps_avx(auVar14);
      VVar42 = Tuple3<pbrt::Vector3,float>::operator-(pTVar3,(Vector3<float> *)&local_d8);
      local_e0._0_4_ =
           VVar42.super_Tuple3<pbrt::Vector3,_float>.z +
           (float)local_c8._0_4_ * local_110.super_Tuple3<pbrt::Normal3,_float>.z +
           (float)local_a8._0_4_ * local_100.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar10._0_4_ =
           VVar42.super_Tuple3<pbrt::Vector3,_float>.x +
           local_110.super_Tuple3<pbrt::Normal3,_float>.x * (float)uVar4 +
           (float)local_a8._0_4_ * local_100.super_Tuple3<pbrt::Normal3,_float>.x;
      auVar10._4_4_ =
           VVar42.super_Tuple3<pbrt::Vector3,_float>.y +
           local_110.super_Tuple3<pbrt::Normal3,_float>.y * (float)uVar4 +
           (float)local_a8._0_4_ * local_100.super_Tuple3<pbrt::Normal3,_float>.y;
      auVar10._8_4_ = (float)uVar32 + (float)uVar4 * 0.0 + (float)local_a8._0_4_ * 0.0;
      auVar10._12_4_ =
           (float)((ulong)uVar32 >> 0x20) + (float)uVar4 * 0.0 + (float)local_a8._0_4_ * 0.0;
    }
    else {
      if (flags != SpecularReflection) goto LAB_0033114f;
      __return_storage_ptr__->hasDifferentials = true;
      PVar44 = Interaction::p(&this->super_Interaction);
      local_d8.z = PVar44.super_Tuple3<pbrt::Point3,_float>.z;
      auVar19._0_8_ = PVar44.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar19._8_56_ = auVar34;
      local_d8._0_8_ = vmovlps_avx(auVar19._0_16_);
      PVar45 = Point3<float>::operator+((Point3<float> *)&local_d8,&this->dpdx);
      auVar20._0_8_ = PVar45.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar20._8_56_ = auVar34;
      uVar32 = vmovlps_avx(auVar20._0_16_);
      (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar32;
      (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar32 >> 0x20);
      (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z =
           PVar45.super_Tuple3<pbrt::Point3,_float>.z;
      PVar44 = Interaction::p(&this->super_Interaction);
      local_d8.z = PVar44.super_Tuple3<pbrt::Point3,_float>.z;
      auVar21._0_8_ = PVar44.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar21._8_56_ = auVar34;
      local_d8._0_8_ = vmovlps_avx(auVar21._0_16_);
      PVar45 = Point3<float>::operator+((Point3<float> *)&local_d8,&this->dpdy);
      auVar22._0_8_ = PVar45.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar22._8_56_ = auVar34;
      uVar32 = vmovlps_avx(auVar22._0_16_);
      (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar32;
      (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar32 >> 0x20);
      (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z =
           PVar45.super_Tuple3<pbrt::Point3,_float>.z;
      auVar7 = vmovshdup_avx(auVar8);
      auVar7 = vfmadd132ss_fma(auVar7,ZEXT416((uint)(local_100.super_Tuple3<pbrt::Normal3,_float>.z
                                                    * fVar35)),
                               ZEXT416((uint)local_100.super_Tuple3<pbrt::Normal3,_float>.y));
      auVar11 = vfmsub213ss_fma(ZEXT416((uint)fVar35),
                                ZEXT416((uint)local_100.super_Tuple3<pbrt::Normal3,_float>.z),
                                ZEXT416((uint)(local_100.super_Tuple3<pbrt::Normal3,_float>.z *
                                              fVar35)));
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(auVar7._0_4_ + auVar11._0_4_)),auVar8,
                               ZEXT416((uint)local_100.super_Tuple3<pbrt::Normal3,_float>.x));
      tVar5 = Dot<float>(c,&local_f0);
      fVar35 = tVar5 + auVar8._0_4_;
      auVar8 = vmovshdup_avx(_local_88);
      auVar8 = vfmadd132ss_fma(auVar8,ZEXT416((uint)(local_100.super_Tuple3<pbrt::Normal3,_float>.z
                                                    * fVar36)),
                               ZEXT416((uint)local_100.super_Tuple3<pbrt::Normal3,_float>.y));
      auVar7 = vfmsub213ss_fma(ZEXT416((uint)fVar36),
                               ZEXT416((uint)local_100.super_Tuple3<pbrt::Normal3,_float>.z),
                               ZEXT416((uint)(local_100.super_Tuple3<pbrt::Normal3,_float>.z *
                                             fVar36)));
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(auVar8._0_4_ + auVar7._0_4_)),_local_88,
                               ZEXT416((uint)local_100.super_Tuple3<pbrt::Normal3,_float>.x));
      tVar5 = Dot<float>(c,&local_110);
      pTVar3 = local_e0;
      fVar36 = tVar5 + auVar8._0_4_;
      uVar32 = 0;
      VVar42 = Tuple3<pbrt::Vector3,float>::operator-(local_e0,(Vector3<float> *)&local_50);
      uStack_80 = uVar32;
      local_88 = (undefined1  [8])VVar42.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      tVar5 = Dot<float>(c,&local_100);
      fVar29 = tVar5 * local_f0.super_Tuple3<pbrt::Normal3,_float>.z +
               fVar35 * local_100.super_Tuple3<pbrt::Normal3,_float>.z;
      fVar6 = tVar5 * local_f0.super_Tuple3<pbrt::Normal3,_float>.x +
              fVar35 * local_100.super_Tuple3<pbrt::Normal3,_float>.x;
      fVar28 = tVar5 * local_f0.super_Tuple3<pbrt::Normal3,_float>.y +
               fVar35 * local_100.super_Tuple3<pbrt::Normal3,_float>.y;
      fVar30 = tVar5 * 0.0 + fVar35 * 0.0;
      fVar35 = tVar5 * 0.0 + fVar35 * 0.0;
      auVar9._0_4_ = fVar6 + fVar6 + (float)local_88._0_4_;
      auVar9._4_4_ = fVar28 + fVar28 + (float)local_88._4_4_;
      auVar9._8_4_ = fVar30 + fVar30 + (float)uStack_80;
      auVar9._12_4_ = fVar35 + fVar35 + uStack_80._4_4_;
      uVar31 = auVar9._8_8_;
      uVar32 = vmovlps_avx(auVar9);
      (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x =
           (float)(int)uVar32;
      (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)uVar32 >> 0x20);
      (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z =
           fVar29 + fVar29 + VVar42.super_Tuple3<pbrt::Vector3,_float>.z;
      VVar42 = Tuple3<pbrt::Vector3,float>::operator-(pTVar3,(Vector3<float> *)&local_40);
      local_e0 = (Tuple3<pbrt::Vector3,_float> *)
                 CONCAT44(local_e0._4_4_,VVar42.super_Tuple3<pbrt::Vector3,_float>.z);
      tVar5 = Dot<float>(c,&local_100);
      fVar35 = tVar5 * local_110.super_Tuple3<pbrt::Normal3,_float>.z +
               fVar36 * local_100.super_Tuple3<pbrt::Normal3,_float>.z;
      local_e0._0_4_ = fVar35 + fVar35 + local_e0._0_4_;
      fVar35 = tVar5 * local_110.super_Tuple3<pbrt::Normal3,_float>.x +
               fVar36 * local_100.super_Tuple3<pbrt::Normal3,_float>.x;
      fVar29 = tVar5 * local_110.super_Tuple3<pbrt::Normal3,_float>.y +
               fVar36 * local_100.super_Tuple3<pbrt::Normal3,_float>.y;
      fVar6 = tVar5 * 0.0 + fVar36 * 0.0;
      fVar36 = tVar5 * 0.0 + fVar36 * 0.0;
      local_128 = VVar42.super_Tuple3<pbrt::Vector3,_float>.x;
      fStack_124 = VVar42.super_Tuple3<pbrt::Vector3,_float>.y;
      fStack_120 = (float)uVar31;
      fStack_11c = (float)((ulong)uVar31 >> 0x20);
      auVar10._0_4_ = fVar35 + fVar35 + local_128;
      auVar10._4_4_ = fVar29 + fVar29 + fStack_124;
      auVar10._8_4_ = fVar6 + fVar6 + fStack_120;
      auVar10._12_4_ = fVar36 + fVar36 + fStack_11c;
    }
    uVar32 = vmovlps_avx(auVar10);
    (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar32;
    (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y =
         (float)(int)((ulong)uVar32 >> 0x20);
    (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.z = local_e0._0_4_;
  }
LAB_0033114f:
  fVar35 = (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar8 = ZEXT416((uint)(__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x)
  ;
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar35 * fVar35)),auVar8,auVar8);
  auVar7 = ZEXT416((uint)(__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z)
  ;
  auVar8 = vfmadd213ss_fma(auVar7,auVar7,auVar8);
  if (auVar8._0_4_ <= 1e+16) {
    fVar35 = (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y;
    auVar8 = ZEXT416((uint)(__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.
                           x);
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar35 * fVar35)),auVar8,auVar8);
    auVar7 = ZEXT416((uint)(__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.
                           z);
    auVar8 = vfmadd213ss_fma(auVar7,auVar7,auVar8);
    if (auVar8._0_4_ <= 1e+16) {
      fVar35 = (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y;
      auVar8 = ZEXT416((uint)(__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x)
      ;
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar35 * fVar35)),auVar8,auVar8);
      auVar7 = ZEXT416((uint)(__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z)
      ;
      auVar8 = vfmadd231ss_fma(auVar8,auVar7,auVar7);
      if (auVar8._0_4_ <= 1e+16) {
        fVar35 = (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y;
        auVar8 = ZEXT416((uint)(__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.
                               x);
        auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar35 * fVar35)),auVar8,auVar8);
        auVar7 = ZEXT416((uint)(__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.
                               z);
        auVar8 = vfmadd231ss_fma(auVar8,auVar7,auVar7);
        if (auVar8._0_4_ <= 1e+16) {
          return __return_storage_ptr__;
        }
      }
    }
  }
  __return_storage_ptr__->hasDifferentials = false;
  return __return_storage_ptr__;
}

Assistant:

RayDifferential SurfaceInteraction::SpawnRay(const RayDifferential &rayi,
                                             const BSDF &bsdf, const Vector3f &wi,
                                             BxDFFlags flags) const {
    RayDifferential rd(SpawnRay(wi));
    if (rayi.hasDifferentials) {
        // Compute ray differentials for specular reflection or transmission
        // Compute common factors for specular ray differentials
        Normal3f ns = shading.n;
        Normal3f dndx = shading.dndu * dudx + shading.dndv * dvdx;
        Normal3f dndy = shading.dndu * dudy + shading.dndv * dvdy;
        Vector3f dwodx = -rayi.rxDirection - wo, dwody = -rayi.ryDirection - wo;

        if (flags == (BxDFFlags::Reflection | BxDFFlags::Specular)) {
            // Initialize origins of specular differential rays
            rd.hasDifferentials = true;
            rd.rxOrigin = p() + dpdx;
            rd.ryOrigin = p() + dpdy;

            // Compute differential reflected directions
            Float dDNdx = Dot(dwodx, ns) + Dot(wo, dndx);
            Float dDNdy = Dot(dwody, ns) + Dot(wo, dndy);
            rd.rxDirection = wi - dwodx + 2.f * Vector3f(Dot(wo, ns) * dndx + dDNdx * ns);
            rd.ryDirection = wi - dwody + 2.f * Vector3f(Dot(wo, ns) * dndy + dDNdy * ns);

        } else if (flags == (BxDFFlags::Transmission | BxDFFlags::Specular)) {
            // Initialize origins of specular differential rays
            rd.hasDifferentials = true;
            rd.rxOrigin = p() + dpdx;
            rd.ryOrigin = p() + dpdy;

            // Compute differential transmitted directions
            // NOTE: eta coming in is now 1/eta from the derivation below, so
            // there's a 1/ here now...
            Float eta = 1 / bsdf.eta;
            if (Dot(wo, ns) < 0) {
                ns = -ns;
                dndx = -dndx;
                dndy = -dndy;
            }
            Float dDNdx = Dot(dwodx, ns) + Dot(wo, dndx);
            Float dDNdy = Dot(dwody, ns) + Dot(wo, dndy);
            // Compute partial derivatives of $\mu$
            Float mu = eta * Dot(wo, ns) - AbsDot(wi, ns);
            Float dmudx = (eta - (eta * eta * Dot(wo, ns)) / AbsDot(wi, ns)) * dDNdx;
            Float dmudy = (eta - (eta * eta * Dot(wo, ns)) / AbsDot(wi, ns)) * dDNdy;

            rd.rxDirection = wi - eta * dwodx + Vector3f(mu * dndx + dmudx * ns);
            rd.ryDirection = wi - eta * dwody + Vector3f(mu * dndy + dmudy * ns);
        }
    }
    // Squash potentially troublesome differentials
    // After many specuar bounces (e.g. the Transparent Machines scenes),
    // differentials can drift off to have large magnitudes, which ends up
    // leaving a trail of Infs and NaNs in their wake. We'll disable the
    // differentials when this seems to be happening.
    //
    // TODO: this is unsatisfying and would be nice to address in a more
    // principled way.
    if (LengthSquared(rd.rxDirection) > 1e16f || LengthSquared(rd.ryDirection) > 1e16f ||
        LengthSquared(Vector3f(rd.rxOrigin)) > 1e16f ||
        LengthSquared(Vector3f(rd.ryOrigin)) > 1e16f)
        rd.hasDifferentials = false;

    return rd;
}